

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::api_copy_ctor(void)

{
  size_type local_2c8;
  undefined4 local_2bc;
  char input [9];
  reader reader;
  reader copy;
  
  builtin_strncpy(input,"[ null ]",9);
  copy.decoder.input.head = (const_pointer)strlen(input);
  copy.decoder.input.tail = input;
  trial::protocol::json::basic_reader<char>::basic_reader(&reader,(view_type *)&copy);
  trial::protocol::json::basic_reader<char>::next(&reader);
  copy.decoder.input.head =
       (const_pointer)CONCAT44(copy.decoder.input.head._4_4_,reader.decoder.current.code);
  local_2c8._0_4_ = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x26,"void basic_suite::api_copy_ctor()",&copy,&local_2c8);
  copy.decoder.input.head = (const_pointer)trial::protocol::json::basic_reader<char>::level(&reader)
  ;
  local_2c8._0_4_ = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x27,"void basic_suite::api_copy_ctor()",&copy,&local_2c8);
  trial::protocol::json::basic_reader<char>::basic_reader(&copy,&reader);
  local_2c8 = CONCAT44(local_2c8._4_4_,reader.decoder.current.code);
  local_2bc = 5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::null",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x29,"void basic_suite::api_copy_ctor()",&local_2c8,&local_2bc);
  local_2c8 = trial::protocol::json::basic_reader<char>::level(&reader);
  local_2bc = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("reader.level()","1",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0x2a,"void basic_suite::api_copy_ctor()",&local_2c8,&local_2bc);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&copy.stack);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&reader.stack);
  return;
}

Assistant:

void api_copy_ctor()
{
    const char input[] = "[ null ]";
    json::reader reader(input);
    reader.next();
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
    json::reader copy(reader);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::null);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.level(), 1);
}